

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void u_entered_shop(char *enterstring)

{
  short sVar1;
  undefined4 uVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  monst *mtmp;
  char *pcVar6;
  obj *poVar7;
  obj *poVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  
  if (*enterstring == '\0') {
    return;
  }
  nomul(0,(char *)0x0);
  mtmp = shop_keeper(level,*enterstring);
  if (mtmp == (monst *)0x0) {
    pcVar6 = strchr(u_entered_shop::empty_shops,(int)*enterstring);
    if (pcVar6 != (char *)0x0) goto LAB_0022a6de;
    pcVar6 = in_rooms(level,u.ux,u.uy,0x12);
    pcVar10 = in_rooms(level,u.ux0,u.uy0,0x12);
    if (pcVar6 == pcVar10) goto LAB_0022a6de;
  }
  else {
    iVar5 = inhishop(mtmp);
    if (iVar5 != 0) {
      *(undefined1 **)&mtmp[0x1b].mnum = &mtmp->field_0x74;
      sVar1._0_1_ = mtmp[0x1b].mnamelth;
      sVar1._1_1_ = mtmp[0x1b].mxtyp;
      if ((sVar1 == 0) || (mtmp[0x1b].field_0x75 != '\0')) {
        iVar5 = strncasecmp(&mtmp[0x1b].field_0x75,plname,0x20);
        if (iVar5 != 0) {
          mtmp[0x1b].mnamelth = '\0';
          mtmp[0x1b].mxtyp = '\0';
          *(undefined1 *)((long)&mtmp[0x1b].meating + 1) = 0;
          strncpy(&mtmp[0x1b].field_0x75,plname,0x20);
          pacify_shk(mtmp);
        }
      }
      if ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) {
        return;
      }
      if (*(char *)((long)&mtmp[0x1b].meating + 1) != '\0') {
        return;
      }
      if (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
           (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
         (u.uprops[0xd].blocked == 0)) {
        pline("%s senses your presence.",(undefined1 *)((long)&mtmp[0x1c].minvent + 5));
        bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
        if (bVar3 == '\0') {
          pcVar6 = "Invisible customers are not welcome!";
          goto LAB_0022a760;
        }
      }
      if ((((uarmu != (obj *)0x0) && (uarmu->otyp == 0x7a)) && (uarm == (obj *)0x0)) &&
         (uarmc == (obj *)0x0)) {
        bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
        mtmp[0x1b].field_0x74 = bVar3 == '\0';
      }
      bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
      if ((0 < u.umonnum && bVar3 != '\0') && (mons[(uint)u.umonnum].mlet != '5')) {
        pcVar6 = "Non-human customers are not welcome!";
LAB_0022a760:
        verbalize(pcVar6);
        return;
      }
      lVar11 = (long)*(char *)((long)level->monsters + (long)*enterstring * 0xd8 + 0x335c);
      if ((mtmp->field_0x62 & 0x40) == 0) {
        pcVar6 = s_suffix((char *)((long)&mtmp[0x1c].minvent + 5));
        verbalize("So, %s, you dare return to %s %s?!",plname,pcVar6,
                  (&PTR_false_rumor_start_0030b490)[lVar11 * 0x18]);
      }
      else {
        iVar5._0_1_ = mtmp[0x1b].mtame;
        iVar5._1_1_ = mtmp[0x1b].m_ap_type;
        iVar5._2_1_ = mtmp[0x1b].mfrozen;
        iVar5._3_1_ = mtmp[0x1b].mblinded;
        if (iVar5 == 0) {
          if ((mtmp[0x1b].field_0x74 == '\0') ||
             (cVar4 = inside_shop(level,u.ux,u.uy), cVar4 != '\0')) {
            pcVar6 = Hello(mtmp);
            uVar2._0_1_ = mtmp[0x1b].mnamelth;
            uVar2._1_1_ = mtmp[0x1b].mxtyp;
            uVar2._2_2_ = mtmp[0x1b].mxlth;
            *(short *)&mtmp[0x1b].mnamelth = (short)uVar2 + 1;
            pcVar10 = " again";
            if ((short)uVar2 == 0) {
              pcVar10 = "";
            }
            pcVar9 = s_suffix((char *)((long)&mtmp[0x1c].minvent + 5));
            verbalize("%s, %s!  Welcome%s to %s %s!",pcVar6,plname,pcVar10,pcVar9,
                      (&PTR_false_rumor_start_0030b490)[lVar11 * 0x18]);
          }
        }
        else {
          pline("%s mutters imprecations against shoplifters.",
                (undefined1 *)((long)&mtmp[0x1c].minvent + 5));
        }
      }
      cVar4 = inside_shop(level,u.ux,u.uy);
      if (cVar4 != '\0') {
        return;
      }
      bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
      if (bVar3 != '\0') {
        return;
      }
      poVar7 = carrying(0x108);
      poVar8 = carrying(0x33);
      if (poVar7 == (obj *)0x0 && poVar8 == (obj *)0x0) {
        if (u.usteed == (monst *)0x0) {
          if (mtmp[0x1b].field_0x74 == '\0') {
            if (u.uprops[0x1a].extrinsic == 0 && u.uprops[0x1a].intrinsic == 0) {
              return;
            }
            poVar7 = sobj_at(0x108,level,(int)u.ux,(int)u.uy);
            if ((poVar7 == (obj *)0x0) &&
               (poVar7 = sobj_at(0x33,level,(int)u.ux,(int)u.uy), poVar7 == (obj *)0x0)) {
              return;
            }
          }
          else {
            verbalize("I don\'t sell to your kind here.");
          }
        }
        else {
          pcVar6 = "Will you please leave %s outside?";
          if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
            pcVar6 = "Leave %s outside.";
          }
          pcVar10 = y_monnam(u.usteed);
          verbalize(pcVar6,pcVar10);
        }
        goto LAB_0022aa00;
      }
      if (poVar7 == (obj *)0x0 || poVar8 == (obj *)0x0) {
        iVar5 = 1;
        if (poVar7 == (obj *)0x0) {
          while (poVar8 = poVar8->nobj, poVar8 != (obj *)0x0) {
            iVar5 = iVar5 + (uint)(poVar8->otyp == 0x33);
          }
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0022a913;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022a90a;
LAB_0022a9b9:
            discover_object(0x33,'\x01','\x01');
          }
          else {
LAB_0022a90a:
            if (ublindf != (obj *)0x0) {
LAB_0022a913:
              if (ublindf->oartifact == '\x1d') goto LAB_0022a9b9;
            }
          }
          pcVar6 = "mattock";
        }
        else {
          pcVar6 = "pick-axe";
          while (poVar7 = poVar7->nobj, poVar7 != (obj *)0x0) {
            iVar5 = iVar5 + (uint)(poVar7->otyp == 0x108);
          }
        }
      }
      else {
        pcVar6 = "digging tool";
        iVar5 = 2;
      }
      pcVar10 = "Will you please leave your %s%s outside?";
      if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
        pcVar10 = "Leave the %s%s outside.";
      }
      pcVar9 = "s";
      if (iVar5 == 1) {
        pcVar9 = "";
      }
      verbalize(pcVar10,pcVar6,pcVar9);
LAB_0022aa00:
      dochug(mtmp);
      return;
    }
    mtmp[0x1b].mnum = -1000;
    mtmp[0x1b].m_lev = 0xff;
    mtmp[0x1b].mx = -1;
    mtmp[0x1b].my = -1;
    mtmp[0x1b].mux = -1;
    mtmp[0x1b].muy = -1;
    mtmp[0x1b].malign = -1;
    pcVar6 = strchr(u_entered_shop::empty_shops,(int)*enterstring);
    if (pcVar6 != (char *)0x0) goto LAB_0022a6de;
  }
  pline("This shop appears to be deserted.");
LAB_0022a6de:
  strcpy(u_entered_shop::empty_shops,u.ushops);
  u.ushops[0] = '\0';
  return;
}

Assistant:

void u_entered_shop(char *enterstring)
{

	int rt;
	struct monst *shkp;
	struct eshk *eshkp;
	static const char no_shk[] = "This shop appears to be deserted.";
	static char empty_shops[5];

	if (!*enterstring)
	    return;

	/* interrupt multi-turn stuff */
	nomul(0, NULL);

	if (!(shkp = shop_keeper(level, *enterstring))) {
	    if (!strchr(empty_shops, *enterstring) &&
		in_rooms(level, u.ux, u.uy, SHOPBASE) !=
				  in_rooms(level, u.ux0, u.uy0, SHOPBASE))
		pline(no_shk);
	    strcpy(empty_shops, u.ushops);
	    u.ushops[0] = '\0';
	    return;
	}

	eshkp = ESHK(shkp);

	if (!inhishop(shkp)) {
	    /* dump core when referenced */
	    eshkp->bill_p = (struct bill_x *) -1000;
	    if (!strchr(empty_shops, *enterstring))
		pline(no_shk);
	    strcpy(empty_shops, u.ushops);
	    u.ushops[0] = '\0';
	    return;
	}

	eshkp->bill_p = &(eshkp->bill[0]);

	if ((!eshkp->visitct || *eshkp->customer) &&
	    strncmpi(eshkp->customer, plname, PL_NSIZ)) {
	    /* You seem to be new here */
	    eshkp->visitct = 0;
	    eshkp->following = 0;
	    strncpy(eshkp->customer,plname,PL_NSIZ);
	    pacify_shk(shkp);
	}

	if (shkp->msleeping || !shkp->mcanmove || eshkp->following)
	    return;	/* no dialog */

	if (Invis) {
	    pline("%s senses your presence.", shkname(shkp));
	    if (!Is_blackmarket(&u.uz)) {
		verbalize("Invisible customers are not welcome!");
		return;
	    }
	}

	/* visible striped prison shirt (but black marketeer won't mind) */
	if (uarmu && uarmu->otyp == STRIPED_SHIRT && !uarm && !uarmc)
	    eshkp->pbanned = !Is_blackmarket(&u.uz);

	if (Is_blackmarket(&u.uz) &&
		u.umonnum > 0 && mons[u.umonnum].mlet != S_HUMAN) {
	    verbalize("Non-human customers are not welcome!");
	    return;
	}

	rt = level->rooms[*enterstring - ROOMOFFSET].rtype;

	if (ANGRY(shkp)) {
	    verbalize("So, %s, you dare return to %s %s?!",
		      plname,
		      s_suffix(shkname(shkp)),
		      shtypes[rt - SHOPBASE].name);
	} else if (eshkp->robbed) {
	    pline("%s mutters imprecations against shoplifters.", shkname(shkp));
	} else if (!eshkp->pbanned || inside_shop(level, u.ux, u.uy)) {
	    verbalize("%s, %s!  Welcome%s to %s %s!",
		      Hello(shkp), plname,
		      eshkp->visitct++ ? " again" : "",
		      s_suffix(shkname(shkp)),
		      shtypes[rt - SHOPBASE].name);
	}
	/* can't do anything about blocking if teleported in */
	if (!inside_shop(level, u.ux, u.uy) && !Is_blackmarket(&u.uz)) {
	    boolean should_block;
	    int cnt;
	    const char *tool;
	    struct obj *pick = carrying(PICK_AXE),
		       *mattock = carrying(DWARVISH_MATTOCK);

	    if (pick || mattock) {
		cnt = 1;	/* so far */
		if (pick && mattock) {	/* carrying both types */
		    tool = "digging tool";
		    cnt = 2;	/* `more than 1' is all that matters */
		} else if (pick) {
		    tool = "pick-axe";
		    /* hack: `pick' already points somewhere into inventory */
		    while ((pick = pick->nobj) != 0)
			if (pick->otyp == PICK_AXE) ++cnt;
		} else {	/* assert(mattock != 0) */
		    tool = "mattock";
		    while ((mattock = mattock->nobj) != 0)
			if (mattock->otyp == DWARVISH_MATTOCK) ++cnt;
		    /* [ALI] Shopkeeper identifies mattock(s) */
		    if (!Blind) makeknown(DWARVISH_MATTOCK);
		}
		verbalize(NOTANGRY(shkp) ?
			  "Will you please leave your %s%s outside?" :
			  "Leave the %s%s outside.",
			  tool, plur(cnt));
		should_block = TRUE;
	    } else if (u.usteed) {
		verbalize(NOTANGRY(shkp) ?
			  "Will you please leave %s outside?" :
			  "Leave %s outside.", y_monnam(u.usteed));
		should_block = TRUE;
	    } else if (eshkp->pbanned) {
		verbalize("I don't sell to your kind here.");
		should_block = TRUE;
	    } else {
		should_block = (Fast && (sobj_at(PICK_AXE, level, u.ux, u.uy) ||
				      sobj_at(DWARVISH_MATTOCK, level, u.ux, u.uy)));
	    }
	    if (should_block) dochug(shkp);  /* shk gets extra move */
	}
	return;
}